

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStrategy.cpp
# Opt level: O1

Report * __thiscall
SimpleStrategy::compareCFGs(Report *__return_storage_ptr__,SimpleStrategy *this,CFG *a,CFG *b)

{
  int iVar1;
  SimpleStrategy *this_00;
  SimpleStrategy *this_01;
  set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> callsB;
  set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> callsA;
  set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> edgesB;
  set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> edgesA;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> phantomsB;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> phantomsA;
  set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_> blocksB;
  set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_> blocksA;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> instrsB;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> instrsA;
  set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> callsAB;
  set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> edgesAB;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> phantomsAB;
  set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_> blocksAB;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> instrsAB;
  CfgData dataB;
  CfgData dataA;
  _Rb_tree<CfgData::Call,_CfgData::Call,_std::_Identity<CfgData::Call>,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
  _Stack_538;
  _Rb_tree<CfgData::Call,_CfgData::Call,_std::_Identity<CfgData::Call>,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
  local_508;
  _Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
  local_4d8;
  _Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
  local_4a8;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_478;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_448;
  _Rb_tree<CfgData::Node,_CfgData::Node,_std::_Identity<CfgData::Node>,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>
  local_418;
  _Rb_tree<CfgData::Node,_CfgData::Node,_std::_Identity<CfgData::Node>,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>
  local_3e8;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_3b8;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_388;
  undefined1 local_358 [88];
  int local_300;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_2f8;
  _Rb_tree<CfgData::Node,_CfgData::Node,_std::_Identity<CfgData::Node>,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>
  local_2c8;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_298;
  undefined1 local_268 [296];
  CfgData local_140;
  
  __return_storage_ptr__->_vptr_Report = (_func_int **)&PTR__Report_00117c58;
  (__return_storage_ptr__->matched)._vptr_Stats = (_func_int **)&PTR__Stats_00117c88;
  (__return_storage_ptr__->matched).cfgs = 0;
  (__return_storage_ptr__->matched).instrs = 0;
  (__return_storage_ptr__->matched).blocks = 0;
  (__return_storage_ptr__->matched).phantoms = 0;
  (__return_storage_ptr__->matched).phantoms = 0;
  (__return_storage_ptr__->matched).edges = 0;
  (__return_storage_ptr__->matched).calls = 0;
  (__return_storage_ptr__->matched).indirects = 0;
  (__return_storage_ptr__->unmatched).a._vptr_Stats = (_func_int **)&PTR__Stats_00117c88;
  (__return_storage_ptr__->unmatched).a.cfgs = 0;
  (__return_storage_ptr__->unmatched).a.instrs = 0;
  (__return_storage_ptr__->unmatched).a.blocks = 0;
  (__return_storage_ptr__->unmatched).a.phantoms = 0;
  (__return_storage_ptr__->unmatched).a.phantoms = 0;
  (__return_storage_ptr__->unmatched).a.edges = 0;
  (__return_storage_ptr__->unmatched).a.calls = 0;
  (__return_storage_ptr__->unmatched).a.indirects = 0;
  (__return_storage_ptr__->unmatched).b._vptr_Stats = (_func_int **)&PTR__Stats_00117c88;
  (__return_storage_ptr__->unmatched).b.cfgs = 0;
  (__return_storage_ptr__->unmatched).b.instrs = 0;
  (__return_storage_ptr__->unmatched).b.blocks = 0;
  (__return_storage_ptr__->unmatched).b.phantoms = 0;
  (__return_storage_ptr__->unmatched).b.phantoms = 0;
  (__return_storage_ptr__->unmatched).b.edges = 0;
  (__return_storage_ptr__->unmatched).b.calls = 0;
  (__return_storage_ptr__->unmatched).b.indirects = 0;
  CfgData::CfgData(&local_140,a);
  CfgData::CfgData((CfgData *)local_268,b);
  (__return_storage_ptr__->matched).cfgs = 1;
  (__return_storage_ptr__->unmatched).a.cfgs = 0;
  (__return_storage_ptr__->unmatched).b.cfgs = 0;
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::_Rb_tree(&local_388,&local_140.m_instrs._M_t);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::_Rb_tree(&local_3b8,
             (_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              *)(local_268 + 8));
  matchGeneric<unsigned_long>
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &local_298,this,
             (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &local_388,
             (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &local_3b8);
  (__return_storage_ptr__->matched).instrs =
       (int)local_298._M_impl.super__Rb_tree_header._M_node_count;
  (__return_storage_ptr__->unmatched).a.instrs =
       (int)local_388._M_impl.super__Rb_tree_header._M_node_count;
  (__return_storage_ptr__->unmatched).b.instrs =
       (int)local_3b8._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Rb_tree<CfgData::Node,_CfgData::Node,_std::_Identity<CfgData::Node>,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>
  ::_Rb_tree(&local_3e8,&local_140.m_blocks._M_t);
  std::
  _Rb_tree<CfgData::Node,_CfgData::Node,_std::_Identity<CfgData::Node>,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>
  ::_Rb_tree(&local_418,
             (_Rb_tree<CfgData::Node,_CfgData::Node,_std::_Identity<CfgData::Node>,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>
              *)(local_268 + 0x38));
  matchGeneric<CfgData::Node>
            ((set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_> *)
             &local_2c8,this,
             (set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_> *)
             &local_3e8,
             (set<CfgData::Node,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_> *)
             &local_418);
  (__return_storage_ptr__->matched).blocks =
       (int)local_2c8._M_impl.super__Rb_tree_header._M_node_count;
  (__return_storage_ptr__->unmatched).a.blocks =
       (int)local_3e8._M_impl.super__Rb_tree_header._M_node_count;
  (__return_storage_ptr__->unmatched).b.blocks =
       (int)local_418._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::_Rb_tree(&local_448,&local_140.m_phantoms._M_t);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::_Rb_tree(&local_478,
             (_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              *)(local_268 + 0x68));
  matchGeneric<unsigned_long>
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &local_2f8,this,
             (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &local_448,
             (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &local_478);
  (__return_storage_ptr__->matched).phantoms =
       (int)local_2f8._M_impl.super__Rb_tree_header._M_node_count;
  (__return_storage_ptr__->unmatched).a.phantoms =
       (int)local_448._M_impl.super__Rb_tree_header._M_node_count;
  (__return_storage_ptr__->unmatched).b.phantoms =
       (int)local_478._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
  ::_Rb_tree(&local_4a8,&local_140.m_edges._M_t);
  std::
  _Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
  ::_Rb_tree(&local_4d8,
             (_Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
              *)(local_268 + 0x98));
  matchGeneric<CfgData::Edge>
            ((set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> *)
             (local_358 + 0x30),this,
             (set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> *)
             &local_4a8,
             (set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> *)
             &local_4d8);
  (__return_storage_ptr__->matched).edges = local_300;
  (__return_storage_ptr__->unmatched).a.edges =
       (int)local_4a8._M_impl.super__Rb_tree_header._M_node_count;
  (__return_storage_ptr__->unmatched).b.edges =
       (int)local_4d8._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Rb_tree<CfgData::Call,_CfgData::Call,_std::_Identity<CfgData::Call>,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
  ::_Rb_tree(&local_508,&local_140.m_calls._M_t);
  this_00 = (SimpleStrategy *)(local_268 + 200);
  std::
  _Rb_tree<CfgData::Call,_CfgData::Call,_std::_Identity<CfgData::Call>,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
  ::_Rb_tree(&_Stack_538,
             (_Rb_tree<CfgData::Call,_CfgData::Call,_std::_Identity<CfgData::Call>,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
              *)this_00);
  this_01 = (SimpleStrategy *)local_358;
  matchCalls((set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *)this_01
             ,this_00,(set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
                       *)&local_508,
             (set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *)
             &_Stack_538);
  iVar1 = countCalls(this_01,(set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
                              *)local_358);
  (__return_storage_ptr__->matched).calls = iVar1;
  iVar1 = countCalls(this_01,(set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
                              *)&local_508);
  (__return_storage_ptr__->unmatched).a.calls = iVar1;
  iVar1 = countCalls(this_01,(set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
                              *)&_Stack_538);
  (__return_storage_ptr__->unmatched).b.calls = iVar1;
  std::
  _Rb_tree<CfgData::Call,_CfgData::Call,_std::_Identity<CfgData::Call>,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
  ::~_Rb_tree((_Rb_tree<CfgData::Call,_CfgData::Call,_std::_Identity<CfgData::Call>,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
               *)local_358);
  std::
  _Rb_tree<CfgData::Call,_CfgData::Call,_std::_Identity<CfgData::Call>,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
  ::~_Rb_tree(&_Stack_538);
  std::
  _Rb_tree<CfgData::Call,_CfgData::Call,_std::_Identity<CfgData::Call>,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
  ::~_Rb_tree(&local_508);
  std::
  _Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
  ::~_Rb_tree((_Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
               *)(local_358 + 0x30));
  std::
  _Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
  ::~_Rb_tree(&local_4d8);
  std::
  _Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
  ::~_Rb_tree(&local_4a8);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_2f8);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_478);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_448);
  std::
  _Rb_tree<CfgData::Node,_CfgData::Node,_std::_Identity<CfgData::Node>,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>
  ::~_Rb_tree(&local_2c8);
  std::
  _Rb_tree<CfgData::Node,_CfgData::Node,_std::_Identity<CfgData::Node>,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>
  ::~_Rb_tree(&local_418);
  std::
  _Rb_tree<CfgData::Node,_CfgData::Node,_std::_Identity<CfgData::Node>,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>
  ::~_Rb_tree(&local_3e8);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_298);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_3b8);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_388);
  CfgData::~CfgData((CfgData *)local_268);
  CfgData::~CfgData(&local_140);
  return __return_storage_ptr__;
}

Assistant:

SimpleStrategy::Report SimpleStrategy::compareCFGs(CFG* a, CFG* b) {
	SimpleStrategy::Report r;

	CfgData dataA(a);
	CfgData dataB(b);

	r.matched.cfgs = 1;
	r.unmatched.a.cfgs = 0;
	r.unmatched.b.cfgs = 0;

	std::set<Addr> instrsA = dataA.instrs();
	std::set<Addr> instrsB = dataB.instrs();
	std::set<Addr> instrsAB = matchGeneric(instrsA, instrsB);
	r.matched.instrs = instrsAB.size();
	r.unmatched.a.instrs = instrsA.size();
	r.unmatched.b.instrs = instrsB.size();

	std::set<CfgData::Node> blocksA = dataA.blocks();
	std::set<CfgData::Node> blocksB = dataB.blocks();
	std::set<CfgData::Node> blocksAB = matchGeneric(blocksA, blocksB);
	r.matched.blocks = blocksAB.size();
	r.unmatched.a.blocks = blocksA.size();
	r.unmatched.b.blocks = blocksB.size();

	std::set<Addr> phantomsA = dataA.phantoms();
	std::set<Addr> phantomsB = dataB.phantoms();
	std::set<Addr> phantomsAB = matchGeneric(phantomsA, phantomsB);
	r.matched.phantoms = phantomsAB.size();
	r.unmatched.a.phantoms = phantomsA.size();
	r.unmatched.b.phantoms = phantomsB.size();

	std::set<CfgData::Edge> edgesA = dataA.edges();
	std::set<CfgData::Edge> edgesB = dataB.edges();
	std::set<CfgData::Edge> edgesAB = matchGeneric(edgesA, edgesB);
	r.matched.edges = edgesAB.size();
	r.unmatched.a.edges = edgesA.size();
	r.unmatched.b.edges = edgesB.size();

	std::set<CfgData::Call> callsA = dataA.calls();
	std::set<CfgData::Call> callsB = dataB.calls();
	std::set<CfgData::Call> callsAB = matchCalls(callsA, callsB);
	r.matched.calls = countCalls(callsAB);
	r.unmatched.a.calls = countCalls(callsA);
	r.unmatched.b.calls = countCalls(callsB);

	return r;
}